

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_SetPrototypeInternal(JSContext *ctx,JSValue obj,JSValue proto_val,BOOL throw_flag)

{
  long lVar1;
  JSValue v;
  int iVar2;
  JSValueUnion in_RCX;
  int in_EDX;
  void *in_RSI;
  JSContext *in_RDI;
  int64_t in_R8;
  int in_R9D;
  BOOL unaff_retaddr;
  JSContext *in_stack_00000008;
  undefined1 in_stack_00000010 [16];
  JSValue in_stack_00000020;
  JSShape *sh;
  JSObject *p1;
  JSObject *p;
  JSObject *proto;
  JSValue in_stack_ffffffffffffff68;
  JSContext *in_stack_ffffffffffffff78;
  JSValueUnion local_50;
  JSValueUnion local_40;
  
  if (in_R9D == 0) {
    if (in_EDX != -1) goto LAB_001275c0;
  }
  else if ((in_EDX == 2) || (in_EDX == 3)) goto LAB_001275c0;
  local_40 = in_RCX;
  if ((int)in_R8 != -1) {
    if ((int)in_R8 != 2) {
LAB_001275c0:
      JS_ThrowTypeErrorNotAnObject((JSContext *)0x1275ca);
      return -1;
    }
    local_40.float64 = 0.0;
  }
  if ((in_R9D != 0) && (in_EDX != -1)) {
    return 1;
  }
  if (*(short *)((long)in_RSI + 6) == 0x29) {
    iVar2 = js_proxy_setPrototypeOf
                      (in_stack_00000008,in_stack_00000020,(JSValue)in_stack_00000010,unaff_retaddr)
    ;
    return iVar2;
  }
  if (*(void **)(*(long *)((long)in_RSI + 0x18) + 0x38) == local_40.ptr) {
    return 1;
  }
  if ((*(byte *)((long)in_RSI + 5) & 1) == 0) {
    if (in_R9D != 0) {
      JS_ThrowTypeError(in_RDI,"object is not extensible");
      return -1;
    }
    return 0;
  }
  if (local_40.ptr != (void *)0x0) {
    local_50.float64 = local_40.float64;
    do {
      if (local_50.ptr == in_RSI) {
        if (in_R9D != 0) {
          JS_ThrowTypeError(in_RDI,"circular prototype chain");
          return -1;
        }
        return 0;
      }
      local_50 = (JSValueUnion)((JSValueUnion *)(*(long *)((long)local_50.ptr + 0x18) + 0x38))->ptr;
    } while (local_50.ptr != (void *)0x0);
    v.tag = in_R8;
    v.u.ptr = in_RCX.ptr;
    in_stack_ffffffffffffff68 = JS_DupValue(in_RDI,v);
  }
  iVar2 = js_shape_prepare_update
                    (in_stack_ffffffffffffff78,(JSObject *)in_stack_ffffffffffffff68.tag,
                     (JSShapeProperty **)in_stack_ffffffffffffff68.u.ptr);
  if (iVar2 != 0) {
    return -1;
  }
  lVar1 = *(long *)((long)in_RSI + 0x18);
  if (*(long *)(lVar1 + 0x38) != 0) {
    JS_FreeValue((JSContext *)0xffffffffffffffff,in_stack_ffffffffffffff68);
  }
  ((JSValueUnion *)(lVar1 + 0x38))->ptr = (void *)local_40;
  return 1;
}

Assistant:

static int JS_SetPrototypeInternal(JSContext *ctx, JSValueConst obj,
                                   JSValueConst proto_val,
                                   BOOL throw_flag)
{
    JSObject *proto, *p, *p1;
    JSShape *sh;

    if (throw_flag) {
        if (JS_VALUE_GET_TAG(obj) == JS_TAG_NULL ||
            JS_VALUE_GET_TAG(obj) == JS_TAG_UNDEFINED)
            goto not_obj;
    } else {
        if (JS_VALUE_GET_TAG(obj) != JS_TAG_OBJECT)
            goto not_obj;
    }
    p = JS_VALUE_GET_OBJ(obj);
    if (JS_VALUE_GET_TAG(proto_val) != JS_TAG_OBJECT) {
        if (JS_VALUE_GET_TAG(proto_val) != JS_TAG_NULL) {
        not_obj:
            JS_ThrowTypeErrorNotAnObject(ctx);
            return -1;
        }
        proto = NULL;
    } else {
        proto = JS_VALUE_GET_OBJ(proto_val);
    }

    if (throw_flag && JS_VALUE_GET_TAG(obj) != JS_TAG_OBJECT)
        return TRUE;

    if (unlikely(p->class_id == JS_CLASS_PROXY))
        return js_proxy_setPrototypeOf(ctx, obj, proto_val, throw_flag);
    sh = p->shape;
    if (sh->proto == proto)
        return TRUE;
    if (!p->extensible) {
        if (throw_flag) {
            JS_ThrowTypeError(ctx, "object is not extensible");
            return -1;
        } else {
            return FALSE;
        }
    }
    if (proto) {
        /* check if there is a cycle */
        p1 = proto;
        do {
            if (p1 == p) {
                if (throw_flag) {
                    JS_ThrowTypeError(ctx, "circular prototype chain");
                    return -1;
                } else {
                    return FALSE;
                }
            }
            /* Note: for Proxy objects, proto is NULL */
            p1 = p1->shape->proto;
        } while (p1 != NULL);
        JS_DupValue(ctx, proto_val);
    }

    if (js_shape_prepare_update(ctx, p, NULL))
        return -1;
    sh = p->shape;
    if (sh->proto)
        JS_FreeValue(ctx, JS_MKPTR(JS_TAG_OBJECT, sh->proto));
    sh->proto = proto;
    return TRUE;
}